

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O0

void __thiscall t_ocaml_generator::generate_service(t_ocaml_generator *this,t_service *tservice)

{
  char *pcVar1;
  ostream *poVar2;
  int __oflag;
  int __oflag_00;
  int __fd;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  allocator local_1b1;
  string local_1b0 [32];
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  string f_service_i_name;
  string local_e8 [48];
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string f_service_name;
  t_service *tservice_local;
  t_ocaml_generator *this_local;
  undefined8 uVar3;
  
  f_service_name.field_2._8_8_ = tservice;
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_78);
  std::__cxx11::string::string
            ((string *)&local_b8,
             (string *)&(this->super_t_oop_generator).super_t_generator.service_name_);
  t_generator::capitalize(&local_98,(t_generator *)this,&local_b8);
  std::operator+(&local_58,&local_78,&local_98);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,".ml");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_78);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e8,pcVar1,(allocator *)(f_service_i_name.field_2._M_local_buf + 0xf));
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_service_,(char *)local_e8,__oflag);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)(f_service_i_name.field_2._M_local_buf + 0xf))
  ;
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_150);
  std::__cxx11::string::string
            ((string *)&local_190,
             (string *)&(this->super_t_oop_generator).super_t_generator.service_name_);
  t_generator::capitalize(&local_170,(t_generator *)this,&local_190);
  std::operator+(&local_130,&local_150,&local_170);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                 &local_130,".mli");
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_150);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,pcVar1,&local_1b1);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_service_i_,(char *)local_1b0,__oflag_00);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  ocaml_autogen_comment_abi_cxx11_(&local_1d8,this);
  poVar2 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1d8);
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  ocaml_imports_abi_cxx11_(&local_1f8,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  ocaml_autogen_comment_abi_cxx11_(&local_218,this);
  poVar2 = std::operator<<((ostream *)&this->f_service_i_,(string *)&local_218);
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  ocaml_imports_abi_cxx11_(&local_238,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_238);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  poVar2 = std::operator<<((ostream *)&this->f_service_,"open ");
  std::__cxx11::string::string
            ((string *)&local_278,
             (string *)&(this->super_t_oop_generator).super_t_generator.program_name_);
  t_generator::capitalize(&local_258,(t_generator *)this,&local_278);
  poVar2 = std::operator<<(poVar2,(string *)&local_258);
  poVar2 = std::operator<<(poVar2,"_types");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  poVar2 = std::operator<<((ostream *)&this->f_service_i_,"open ");
  std::__cxx11::string::string
            ((string *)&local_2b8,
             (string *)&(this->super_t_oop_generator).super_t_generator.program_name_);
  t_generator::capitalize(&local_298,(t_generator *)this,&local_2b8);
  poVar2 = std::operator<<(poVar2,(string *)&local_298);
  poVar2 = std::operator<<(poVar2,"_types");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  generate_service_helpers(this,(t_service *)f_service_name.field_2._8_8_);
  generate_service_interface(this,(t_service *)f_service_name.field_2._8_8_);
  generate_service_client(this,(t_service *)f_service_name.field_2._8_8_);
  uVar3 = f_service_name.field_2._8_8_;
  generate_service_server(this,(t_service *)f_service_name.field_2._8_8_);
  __fd = (int)uVar3;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&this->f_service_,__fd);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&this->f_service_i_,__fd);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void t_ocaml_generator::generate_service(t_service* tservice) {
  string f_service_name = get_out_dir() + capitalize(service_name_) + ".ml";
  f_service_.open(f_service_name.c_str());
  string f_service_i_name = get_out_dir() + capitalize(service_name_) + ".mli";
  f_service_i_.open(f_service_i_name.c_str());

  f_service_ << ocaml_autogen_comment() << endl << ocaml_imports() << endl;
  f_service_i_ << ocaml_autogen_comment() << endl << ocaml_imports() << endl;

  /* if (tservice->get_extends() != nullptr) {
    f_service_ <<
      "open " << capitalize(tservice->get_extends()->get_name()) << endl;
    f_service_i_ <<
      "open " << capitalize(tservice->get_extends()->get_name()) << endl;
  }
  */
  f_service_ << "open " << capitalize(program_name_) << "_types" << endl << endl;

  f_service_i_ << "open " << capitalize(program_name_) << "_types" << endl << endl;

  // Generate the three main parts of the service
  generate_service_helpers(tservice);
  generate_service_interface(tservice);
  generate_service_client(tservice);
  generate_service_server(tservice);

  // Close service file
  f_service_.close();
  f_service_i_.close();
}